

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushStyleColor(ImGuiCol idx,ImVec4 *col)

{
  ImVec4 *pIVar1;
  int iVar2;
  ImGuiColMod *pIVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiContext *pIVar8;
  ImGuiColMod *__dest;
  int iVar9;
  ImVec4 *pIVar10;
  int iVar11;
  
  pIVar8 = GImGui;
  pIVar10 = (GImGui->Style).Colors + idx;
  fVar4 = pIVar10->x;
  fVar5 = pIVar10->y;
  pIVar1 = (GImGui->Style).Colors + idx;
  fVar6 = pIVar1->z;
  fVar7 = pIVar1->w;
  iVar11 = (GImGui->ColorModifiers).Size;
  iVar2 = (GImGui->ColorModifiers).Capacity;
  if (iVar11 == iVar2) {
    iVar11 = iVar11 + 1;
    if (iVar2 == 0) {
      iVar9 = 8;
    }
    else {
      iVar9 = iVar2 / 2 + iVar2;
    }
    if (iVar11 < iVar9) {
      iVar11 = iVar9;
    }
    if (iVar2 < iVar11) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      __dest = (ImGuiColMod *)(*GImAllocatorAllocFunc)((long)iVar11 * 0x14,GImAllocatorUserData);
      pIVar3 = (pIVar8->ColorModifiers).Data;
      if (pIVar3 != (ImGuiColMod *)0x0) {
        memcpy(__dest,pIVar3,(long)(pIVar8->ColorModifiers).Size * 0x14);
        pIVar3 = (pIVar8->ColorModifiers).Data;
        if (pIVar3 != (ImGuiColMod *)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(pIVar3,GImAllocatorUserData);
      }
      (pIVar8->ColorModifiers).Data = __dest;
      (pIVar8->ColorModifiers).Capacity = iVar11;
    }
  }
  pIVar3 = (pIVar8->ColorModifiers).Data;
  iVar11 = (pIVar8->ColorModifiers).Size;
  pIVar3[iVar11].Col = idx;
  pIVar1 = &pIVar3[iVar11].BackupValue;
  pIVar1->x = fVar4;
  pIVar1->y = fVar5;
  pIVar1->z = fVar6;
  pIVar1->w = fVar7;
  (pIVar8->ColorModifiers).Size = (pIVar8->ColorModifiers).Size + 1;
  fVar4 = col->y;
  fVar5 = col->z;
  fVar6 = col->w;
  pIVar10->x = col->x;
  pIVar10->y = fVar4;
  pIVar1 = (pIVar8->Style).Colors + idx;
  pIVar1->z = fVar5;
  pIVar1->w = fVar6;
  return;
}

Assistant:

void ImGui::PushStyleColor(ImGuiCol idx, const ImVec4& col)
{
    ImGuiContext& g = *GImGui;
    ImGuiColMod backup;
    backup.Col = idx;
    backup.BackupValue = g.Style.Colors[idx];
    g.ColorModifiers.push_back(backup);
    g.Style.Colors[idx] = col;
}